

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::BeginGlobal
          (BinaryReaderLogging *this,Index index,Type type,bool mutable_)

{
  Stream *this_00;
  uint uVar1;
  Enum EVar2;
  undefined8 uVar3;
  char *pcVar4;
  string local_48;
  byte local_25;
  uint local_24;
  bool mutable__local;
  BinaryReaderLogging *pBStack_20;
  Index index_local;
  BinaryReaderLogging *this_local;
  Type type_local;
  
  local_25 = mutable_;
  local_24 = index;
  pBStack_20 = this;
  unique0x100000e2 = type;
  WriteIndent(this);
  uVar1 = local_24;
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_48,(Type *)((long)&this_local + 4));
  uVar3 = std::__cxx11::string::c_str();
  pcVar4 = "false";
  if ((local_25 & 1) != 0) {
    pcVar4 = "true";
  }
  Stream::Writef(this_00,"BeginGlobal(index: %u, type: %s, mutable: %s)\n",(ulong)uVar1,uVar3,pcVar4
                );
  std::__cxx11::string::~string((string *)&local_48);
  EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x26])
                    (this->reader_,(ulong)local_24,stack0xffffffffffffffec,(ulong)(local_25 & 1));
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderLogging::BeginGlobal(Index index, Type type, bool mutable_) {
  LOGF("BeginGlobal(index: %" PRIindex ", type: %s, mutable: %s)\n", index,
       type.GetName().c_str(), mutable_ ? "true" : "false");
  return reader_->BeginGlobal(index, type, mutable_);
}